

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O3

void av1_highbd_convolve_2d_scale_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  int iVar2;
  int16_t *piVar3;
  short sVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  uint16_t *puVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint16_t *puVar19;
  uint16_t *puVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  uint16_t uVar25;
  undefined2 *__s;
  uint uVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  short sVar35;
  int iVar36;
  short sVar38;
  int iVar39;
  int iVar40;
  undefined1 in_XMM9 [16];
  undefined1 auVar37 [16];
  int iVar41;
  short sVar42;
  undefined1 in_XMM10 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int16_t tmp [34304];
  ulong uStack_10cd0;
  uint16_t *puStack_10cb8;
  uint uStack_10ca8;
  undefined2 auStack_10c38 [34308];
  
  uVar1 = filter_params_y->taps;
  uVar23 = ((h + -1) * y_step_qn + subpel_y_qn >> 10) + (uint)uVar1;
  __s = auStack_10c38;
  memset(__s,0,0x10c00);
  iVar2 = conv_params->round_0;
  bVar6 = (byte)iVar2;
  iVar5 = 1 << (bVar6 & 0x1f);
  uVar16 = 1 << ((char)bd + 6U & 0x1f);
  lVar11 = (long)(int)uVar23;
  if (0 < w) {
    iVar17 = ((uVar1 >> 1) - 1) * src_stride;
    iVar21 = iVar5 / 2 + uVar16;
    auVar28 = ZEXT416((uint)conv_params->round_0);
    lVar22 = (long)src_stride;
    piVar3 = filter_params_x->filter_ptr;
    uVar1 = filter_params_x->taps;
    uStack_10cd0 = 0;
    do {
      uVar18 = (uint)subpel_x_qn >> 6 & 0xf;
      uVar12 = 0;
      if (3 < (int)uVar23) {
        uStack_10ca8 = (uint)uVar1;
        auVar29 = *(undefined1 (*) [16])(piVar3 + uVar18 * uStack_10ca8);
        puVar19 = src + ((long)(subpel_x_qn >> 10) - (long)iVar17);
        uVar12 = 0;
        do {
          auVar30 = pmaddwd(*(undefined1 (*) [16])(puVar19 + -3),auVar29);
          in_XMM5 = pmaddwd(*(undefined1 (*) [16])(puVar19 + lVar22 + -3),auVar29);
          auVar30 = phaddd(auVar30,in_XMM5);
          auVar32 = pmaddwd(*(undefined1 (*) [16])(puVar19 + (long)(src_stride * 2) + -3),auVar29);
          auVar33 = pmaddwd(*(undefined1 (*) [16])(puVar19 + (long)(src_stride * 3) + -3),auVar29);
          auVar32 = phaddd(auVar32,auVar33);
          auVar30 = phaddd(auVar30,auVar32);
          auVar32._0_4_ = auVar30._0_4_ + iVar21 >> auVar28;
          auVar32._4_4_ = auVar30._4_4_ + iVar21 >> auVar28;
          auVar32._8_4_ = auVar30._8_4_ + iVar21 >> auVar28;
          auVar32._12_4_ = auVar30._12_4_ + iVar21 >> auVar28;
          in_XMM4 = packusdw(auVar32,auVar32);
          *(long *)(__s + uVar12) = in_XMM4._0_8_;
          uVar12 = uVar12 + 4;
          puVar19 = puVar19 + lVar22 * 4;
        } while ((long)uVar12 <= (long)(int)(uVar23 - 4));
      }
      if ((int)uVar12 < (int)uVar23) {
        uVar12 = uVar12 & 0xffffffff;
        lVar24 = (long)src +
                 lVar22 * 2 * uVar12 + (long)(subpel_x_qn >> 10) * 2 + (long)iVar17 * -2 + -6;
        do {
          lVar13 = 0;
          auVar29 = ZEXT416(uVar16);
          do {
            in_XMM4 = pmovsxwd(in_XMM4,*(undefined8 *)
                                        ((long)piVar3 +
                                        lVar13 * 2 +
                                        (ulong)uVar18 * (ulong)((uint)uVar1 + (uint)uVar1)));
            auVar30 = pmovzxwd(in_XMM5,*(undefined8 *)(lVar24 + lVar13 * 2));
            in_XMM5 = pmulld(auVar30,in_XMM4);
            auVar30._0_4_ = auVar29._0_4_ + in_XMM5._0_4_;
            auVar30._4_4_ = auVar29._4_4_ + in_XMM5._4_4_;
            auVar30._8_4_ = auVar29._8_4_ + in_XMM5._8_4_;
            auVar30._12_4_ = auVar29._12_4_ + in_XMM5._12_4_;
            lVar13 = lVar13 + 4;
            auVar29 = auVar30;
          } while (lVar13 != 8);
          auVar29 = phaddd(auVar30,auVar30);
          auVar29 = phaddd(auVar29,auVar29);
          auStack_10c38[uStack_10cd0 * lVar11 + uVar12] =
               (short)(auVar29._0_4_ + (iVar5 >> 1) >> (bVar6 & 0x1f));
          uVar12 = uVar12 + 1;
          lVar24 = lVar24 + lVar22 * 2;
        } while (uVar12 != uVar23);
      }
      uStack_10cd0 = uStack_10cd0 + 1;
      subpel_x_qn = subpel_x_qn + x_step_qn;
      __s = __s + lVar11;
    } while (uStack_10cd0 != (uint)w);
  }
  bVar6 = ((char)bd - bVar6) + 0xe;
  uVar16 = 0xff;
  if (bd == 0xc) {
    uVar16 = 0xfff;
  }
  if (bd == 10) {
    uVar16 = 0x3ff;
  }
  uVar18 = 0xe - (iVar2 + conv_params->round_1);
  bVar7 = (byte)uVar18;
  uVar26 = 1 << (bVar6 & 0x1f);
  if (0 < h) {
    auVar28 = ZEXT416((uint)conv_params->round_1);
    puVar19 = conv_params->dst;
    auVar29 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),0);
    auVar30 = ZEXT416(uVar18);
    iVar21 = (1 << (bVar7 & 0x1f)) >> 1;
    iVar2 = conv_params->fwd_offset;
    auVar33._4_4_ = iVar2;
    auVar33._0_4_ = iVar2;
    auVar33._8_4_ = iVar2;
    auVar33._12_4_ = iVar2;
    iVar2 = conv_params->bck_offset;
    auVar31._4_4_ = iVar2;
    auVar31._0_4_ = iVar2;
    auVar31._8_4_ = iVar2;
    auVar31._12_4_ = iVar2;
    bVar8 = (byte)conv_params->round_1;
    bVar9 = bVar6 - bVar8;
    iVar2 = conv_params->dst_stride;
    iVar5 = ((1 << (bVar8 & 0x1f)) >> 1) + uVar26;
    iVar17 = (-1 << (bVar9 & 0x1f)) + iVar21 + (-1 << (bVar9 - 1 & 0x1f));
    uStack_10cd0 = 0;
    puStack_10cb8 = puVar19;
    do {
      uVar16 = (uint)subpel_y_qn >> 6 & 0xf;
      uVar1 = filter_params_y->taps;
      piVar3 = filter_params_y->filter_ptr;
      uVar12 = 0;
      if (3 < w) {
        pauVar14 = (undefined1 (*) [16])(auStack_10c38 + (subpel_y_qn >> 10));
        auVar32 = *(undefined1 (*) [16])(piVar3 + uVar16 * uVar1);
        uVar12 = 0;
        puVar20 = puStack_10cb8;
        do {
          auVar37 = pmaddwd(*pauVar14,auVar32);
          auVar43 = pmaddwd(*(undefined1 (*) [16])(*pauVar14 + lVar11 * 2),auVar32);
          auVar37 = phaddd(auVar37,auVar43);
          auVar43 = pmaddwd(*(undefined1 (*) [16])(*pauVar14 + (long)(int)(uVar23 * 2) * 2),auVar32)
          ;
          auVar44 = pmaddwd(*(undefined1 (*) [16])(*pauVar14 + (long)(int)(uVar23 * 3) * 2),auVar32)
          ;
          in_XMM10 = phaddd(auVar43,auVar44);
          auVar37 = phaddd(auVar37,in_XMM10);
          auVar43._0_4_ = auVar37._0_4_ + iVar5 >> auVar28;
          auVar43._4_4_ = auVar37._4_4_ + iVar5 >> auVar28;
          auVar43._8_4_ = auVar37._8_4_ + iVar5 >> auVar28;
          auVar43._12_4_ = auVar37._12_4_ + iVar5 >> auVar28;
          if (conv_params->is_compound == 0) {
            auVar37._0_4_ = auVar43._0_4_ + iVar17;
            auVar37._4_4_ = auVar43._4_4_ + iVar17;
            auVar37._8_4_ = auVar43._8_4_ + iVar17;
            auVar37._12_4_ = auVar43._12_4_ + iVar17;
            auVar44 = psraw(auVar37,auVar30);
LAB_00ade4f3:
            auVar37 = packusdw(auVar44,auVar44);
            sVar4 = auVar29._0_2_;
            sVar35 = auVar37._0_2_;
            in_XMM9._0_2_ = (ushort)(sVar4 < sVar35) * sVar4 | (ushort)(sVar4 >= sVar35) * sVar35;
            sVar35 = auVar29._2_2_;
            sVar38 = auVar37._2_2_;
            in_XMM9._2_2_ = (ushort)(sVar35 < sVar38) * sVar35 | (ushort)(sVar35 >= sVar38) * sVar38
            ;
            sVar38 = auVar37._4_2_;
            in_XMM9._4_2_ = (ushort)(sVar4 < sVar38) * sVar4 | (ushort)(sVar4 >= sVar38) * sVar38;
            sVar38 = auVar37._6_2_;
            in_XMM9._6_2_ = (ushort)(sVar35 < sVar38) * sVar35 | (ushort)(sVar35 >= sVar38) * sVar38
            ;
            sVar38 = auVar37._8_2_;
            in_XMM9._8_2_ = (ushort)(sVar4 < sVar38) * sVar4 | (ushort)(sVar4 >= sVar38) * sVar38;
            sVar38 = auVar37._10_2_;
            in_XMM9._10_2_ =
                 (ushort)(sVar35 < sVar38) * sVar35 | (ushort)(sVar35 >= sVar38) * sVar38;
            sVar38 = auVar37._12_2_;
            sVar42 = auVar37._14_2_;
            in_XMM9._12_2_ = (ushort)(sVar4 < sVar38) * sVar4 | (ushort)(sVar4 >= sVar38) * sVar38;
            in_XMM9._14_2_ =
                 (ushort)(sVar35 < sVar42) * sVar35 | (ushort)(sVar35 >= sVar42) * sVar42;
            puVar15 = dst + uStack_10cd0 * (long)dst_stride + uVar12;
          }
          else {
            if (conv_params->do_average != 0) {
              in_XMM10 = pmovzxwd(in_XMM10,*(undefined8 *)puVar20);
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                iVar36 = auVar43._0_4_ + in_XMM10._0_4_ >> 1;
                iVar39 = auVar43._4_4_ + in_XMM10._4_4_ >> 1;
                iVar40 = auVar43._8_4_ + in_XMM10._8_4_ >> 1;
                iVar41 = auVar43._12_4_ + in_XMM10._12_4_ >> 1;
              }
              else {
                in_XMM10 = pmulld(in_XMM10,auVar33);
                auVar37 = pmulld(auVar43,auVar31);
                iVar36 = auVar37._0_4_ + in_XMM10._0_4_ >> 4;
                iVar39 = auVar37._4_4_ + in_XMM10._4_4_ >> 4;
                iVar40 = auVar37._8_4_ + in_XMM10._8_4_ >> 4;
                iVar41 = auVar37._12_4_ + in_XMM10._12_4_ >> 4;
              }
              auVar44._0_4_ = iVar36 + iVar17 >> auVar30;
              auVar44._4_4_ = iVar39 + iVar17 >> auVar30;
              auVar44._8_4_ = iVar40 + iVar17 >> auVar30;
              auVar44._12_4_ = iVar41 + iVar17 >> auVar30;
              goto LAB_00ade4f3;
            }
            in_XMM9 = packusdw(auVar43,auVar43);
            puVar15 = puVar20;
          }
          *(long *)puVar15 = in_XMM9._0_8_;
          uVar12 = uVar12 + 4;
          puVar20 = puVar20 + 4;
          pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar11 * 8);
        } while ((long)uVar12 <= (long)(w + -4));
      }
      if ((int)uVar12 < w) {
        bVar9 = (byte)conv_params->round_1;
        iVar36 = conv_params->is_compound;
        uVar12 = uVar12 & 0xffffffff;
        puVar20 = puVar19 + uStack_10cd0 * (long)iVar2;
        lVar22 = (long)auStack_10c38 + lVar11 * 2 * uVar12 + (long)(subpel_y_qn >> 10) * 2;
        do {
          lVar24 = 0;
          auVar32 = ZEXT416(uVar26);
          do {
            in_XMM9 = pmovzxwd(in_XMM9,*(undefined8 *)
                                        ((long)piVar3 +
                                        lVar24 * 2 + (ulong)((uint)uVar1 * 2) * (ulong)uVar16));
            auVar37 = pmovzxwd(in_XMM10,*(undefined8 *)(lVar22 + lVar24 * 2));
            in_XMM10 = pmaddwd(auVar37,in_XMM9);
            auVar34._0_4_ = auVar32._0_4_ + in_XMM10._0_4_;
            auVar34._4_4_ = auVar32._4_4_ + in_XMM10._4_4_;
            auVar34._8_4_ = auVar32._8_4_ + in_XMM10._8_4_;
            auVar34._12_4_ = auVar32._12_4_ + in_XMM10._12_4_;
            lVar24 = lVar24 + 4;
            auVar32 = auVar34;
          } while (lVar24 != 8);
          auVar32 = phaddd(auVar34,auVar34);
          auVar32 = phaddd(auVar32,auVar32);
          uVar18 = auVar32._0_4_ + ((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x1f);
          uVar25 = (uint16_t)uVar18;
          if (iVar36 == 0) {
            uVar18 = uVar18 & 0xffff;
LAB_00ade63d:
            uVar18 = (int)(uVar18 + (-1 << (bVar6 - bVar9 & 0x1f)) + iVar21 +
                                    (-1 << ((bVar6 - bVar9) - 1 & 0x1f))) >> (bVar7 & 0x1f);
            if (bd == 10) {
              bVar27 = uVar18 < 0x3ff;
              uVar10 = 0x3ff;
            }
            else if (bd == 0xc) {
              bVar27 = uVar18 < 0xfff;
              uVar10 = 0xfff;
            }
            else {
              bVar27 = uVar18 < 0xff;
              uVar10 = 0xff;
            }
            if (bVar27) {
              uVar10 = uVar18;
            }
            puVar15 = dst + uStack_10cd0 * (long)dst_stride;
            uVar25 = (uint16_t)uVar10;
            if ((int)uVar18 < 0) {
              uVar25 = 0;
            }
          }
          else {
            puVar15 = puVar20;
            if (conv_params->do_average != 0) {
              uVar10 = (uint)puVar20[uVar12];
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                uVar18 = (uVar18 & 0xffff) + uVar10 >> 1;
              }
              else {
                uVar18 = (int)((uVar18 & 0xffff) * conv_params->bck_offset +
                              uVar10 * conv_params->fwd_offset) >> 4;
              }
              goto LAB_00ade63d;
            }
          }
          puVar15[uVar12] = uVar25;
          uVar12 = uVar12 + 1;
          lVar22 = lVar22 + lVar11 * 2;
        } while (uVar12 != (uint)w);
      }
      uStack_10cd0 = uStack_10cd0 + 1;
      subpel_y_qn = subpel_y_qn + y_step_qn;
      puStack_10cb8 = puStack_10cb8 + iVar2;
    } while (uStack_10cd0 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_scale_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int x_step_qn, const int subpel_y_qn, const int y_step_qn,
    ConvolveParams *conv_params, int bd) {
  // TODO(yaowu): Move this out of stack
  DECLARE_ALIGNED(16, int16_t,
                  tmp[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE]);
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  const int xtaps = filter_params_x->taps;
  const int ytaps = filter_params_y->taps;
  const int fo_vert = ytaps / 2 - 1;

  memset(tmp, 0, sizeof(tmp));
  assert((xtaps == 8) && (ytaps == 8));
  (void)xtaps;

  // horizontal filter
  highbd_hfilter8(src - fo_vert * src_stride, src_stride, tmp, w, im_h,
                  subpel_x_qn, x_step_qn, filter_params_x, conv_params->round_0,
                  bd);

  // vertical filter (input is transposed)
  highbd_vfilter8(tmp, im_h, dst, dst_stride, w, h, subpel_y_qn, y_step_qn,
                  filter_params_y, conv_params, bd);
}